

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

int __thiscall Dashel::Hub::connect(Hub *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  Stream *pSVar4;
  long *plVar5;
  DashelException *pDVar6;
  undefined4 in_register_00000034;
  pair<std::_Rb_tree_iterator<Dashel::Stream_*>,_bool> pVar7;
  string r;
  string proto;
  string local_40;
  
  proto._M_dataplus._M_p = (pointer)&proto.field_2;
  proto._M_string_length = 0;
  proto.field_2._M_local_buf[0] = '\0';
  lVar3 = std::__cxx11::string::find((char)__fd,0x3a);
  if (lVar3 == -1) {
    pDVar6 = (DashelException *)__cxa_allocate_exception(0x20);
    DashelException::DashelException
              (pDVar6,InvalidTarget,0,"No protocol specified in target.",(Stream *)0x0);
    __cxa_throw(pDVar6,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::substr((ulong)&r,CONCAT44(in_register_00000034,__fd));
  std::__cxx11::string::operator=((string *)&proto,(string *)&r);
  std::__cxx11::string::~string((string *)&r);
  pSVar4 = StreamTypeRegistry::create
                     ((StreamTypeRegistry *)streamTypeRegistry,&proto,
                      (string *)CONCAT44(in_register_00000034,__fd),this);
  if (pSVar4 != (Stream *)0x0) {
    plVar5 = (long *)__dynamic_cast(pSVar4,&Stream::typeinfo,&SelectableStream::typeinfo,
                                    0xffffffffffffffff);
    if (plVar5 != (long *)0x0) {
      r._M_dataplus._M_p = (pointer)(*(long *)(*plVar5 + -0x18) + (long)plVar5);
      std::
      _Rb_tree<Dashel::Stream*,Dashel::Stream*,std::_Identity<Dashel::Stream*>,std::less<Dashel::Stream*>,std::allocator<Dashel::Stream*>>
      ::_M_insert_unique<Dashel::Stream*>
                ((_Rb_tree<Dashel::Stream*,Dashel::Stream*,std::_Identity<Dashel::Stream*>,std::less<Dashel::Stream*>,std::allocator<Dashel::Stream*>>
                  *)&this->streams,(Stream **)&r);
      bVar2 = std::operator!=(&proto,"tcpin");
      if (bVar2) {
        r._M_dataplus._M_p = (pointer)(*(long *)(*plVar5 + -0x18) + (long)plVar5);
        pVar7 = std::
                _Rb_tree<Dashel::Stream*,Dashel::Stream*,std::_Identity<Dashel::Stream*>,std::less<Dashel::Stream*>,std::allocator<Dashel::Stream*>>
                ::_M_insert_unique<Dashel::Stream*>
                          ((_Rb_tree<Dashel::Stream*,Dashel::Stream*,std::_Identity<Dashel::Stream*>,std::less<Dashel::Stream*>,std::allocator<Dashel::Stream*>>
                            *)&this->dataStreams,(Stream **)&r);
        (*this->_vptr_Hub[2])(this,*(long *)(*plVar5 + -0x18) + (long)plVar5,pVar7._8_8_);
      }
      uVar1 = *(undefined8 *)(*plVar5 + -0x18);
      std::__cxx11::string::~string((string *)&proto);
      return (int)plVar5 + (int)uVar1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&r,"Invalid protocol in target: ",(allocator<char> *)&local_40);
  std::__cxx11::string::append((string *)&r);
  std::__cxx11::string::append((char *)&r);
  StreamTypeRegistry::list_abi_cxx11_(&local_40,(StreamTypeRegistry *)streamTypeRegistry);
  std::__cxx11::string::append((string *)&r);
  std::__cxx11::string::~string((string *)&local_40);
  pDVar6 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException(pDVar6,InvalidTarget,0,r._M_dataplus._M_p,(Stream *)0x0);
  __cxa_throw(pDVar6,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Stream* Hub::connect(const std::string& target)
	{
		std::string proto;
		size_t c = target.find_first_of(':');
		if (c == std::string::npos)
			throw DashelException(DashelException::InvalidTarget, 0, "No protocol specified in target.");
		proto = target.substr(0, c);
		// N.B. params = target.substr(c+1)

		SelectableStream* s(dynamic_cast<SelectableStream*>(streamTypeRegistry.create(proto, target, *this)));
		if (!s)
		{
			std::string r = "Invalid protocol in target: ";
			r += proto;
			r += ", known protocol are: ";
			r += streamTypeRegistry.list();
			throw DashelException(DashelException::InvalidTarget, 0, r.c_str());
		}

		/* The caller must have the stream lock held */

		streams.insert(s);
		if (proto != "tcpin")
		{
			dataStreams.insert(s);
			connectionCreated(s);
		}

		return s;
	}